

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTcPrsNode * __thiscall
CTPNStmDoWhileBase::fold_constants(CTPNStmDoWhileBase *this,CTcPrsSymtab *symtab)

{
  CTcPrsNode *pCVar1;
  CTPNStm *pCVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  CTcTokenizer *pCVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pCVar6 = G_tok;
  uVar3 = *(undefined4 *)
           ((long)&(this->super_CTPNStmEnclosing).super_CTPNStm.super_CTPNStmBase.file_ + 4);
  lVar5 = (this->super_CTPNStmEnclosing).super_CTPNStm.super_CTPNStmBase.linenum_;
  uVar4 = *(undefined4 *)
           ((long)&(this->super_CTPNStmEnclosing).super_CTPNStm.super_CTPNStmBase.linenum_ + 4);
  *(undefined4 *)&G_tok->last_desc_ =
       *(undefined4 *)&(this->super_CTPNStmEnclosing).super_CTPNStm.super_CTPNStmBase.file_;
  *(undefined4 *)((long)&pCVar6->last_desc_ + 4) = uVar3;
  *(int *)&pCVar6->last_linenum_ = (int)lVar5;
  *(undefined4 *)((long)&pCVar6->last_linenum_ + 4) = uVar4;
  pCVar1 = this->cond_expr_;
  if (pCVar1 != (CTcPrsNode *)0x0) {
    iVar7 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])(pCVar1,symtab);
    this->cond_expr_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar7);
  }
  pCVar2 = this->body_stm_;
  if (pCVar2 != (CTPNStm *)0x0) {
    iVar7 = (*(pCVar2->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
              [0xf])(pCVar2,symtab);
    this->body_stm_ = (CTPNStm *)CONCAT44(extraout_var_00,iVar7);
  }
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTPNStmDoWhileBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* set our location for any errors that occur */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());

    /* 
     *   fold constants in our condition expression, replacing the
     *   expression with the folded version 
     */
    if (cond_expr_ != 0)
        cond_expr_ = cond_expr_->fold_constants(symtab);

    /* fold constants in the body statement */
    if (body_stm_ != 0)
        body_stm_ = (CTPNStm *)body_stm_->fold_constants(symtab);

    /* we are not directly changed by this operation */
    return this;
}